

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Morse.cpp
# Opt level: O1

void __thiscall
OpenMD::Morse::addExplicitInteraction
          (Morse *this,AtomType *atype1,AtomType *atype2,RealType De,RealType Re,RealType beta,
          MorseType mt)

{
  pointer pvVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  pair<std::_Rb_tree_iterator<int>,_bool> pVar8;
  int atid2;
  int atid1;
  int local_50;
  int local_4c;
  RealType local_48;
  RealType local_40;
  RealType local_38;
  
  local_48 = De;
  local_40 = Re;
  local_38 = beta;
  local_4c = AtomType::getIdent(atype1);
  local_50 = AtomType::getIdent(atype2);
  pVar8 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     &this->Mtypes,&local_4c);
  if (pVar8.second == false) {
    iVar5 = (this->Mtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[local_4c];
  }
  else {
    iVar5 = this->nM_;
    (this->Mtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[local_4c] = iVar5;
    this->nM_ = this->nM_ + 1;
  }
  pVar8 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     &this->Mtypes,&local_50);
  if (pVar8.second == false) {
    iVar6 = (this->Mtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[local_50];
  }
  else {
    iVar6 = this->nM_;
    (this->Mtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[local_50] = iVar6;
    this->nM_ = this->nM_ + 1;
  }
  std::
  vector<std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>,_std::allocator<std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>_>_>
  ::resize(&this->MixingMap,(long)this->nM_);
  lVar7 = (long)iVar5;
  std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>::resize
            ((this->MixingMap).
             super__Vector_base<std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>,_std::allocator<std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar7,(long)this->nM_);
  pvVar1 = (this->MixingMap).
           super__Vector_base<std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>,_std::allocator<std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)iVar6;
  lVar2 = *(long *)&pvVar1[lVar7].
                    super__Vector_base<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>
                    ._M_impl.super__Vector_impl_data;
  lVar4 = lVar3 * 0x20;
  *(RealType *)(lVar2 + lVar4) = local_48;
  *(RealType *)(lVar2 + 8 + lVar4) = local_40;
  *(RealType *)(lVar2 + 0x10 + lVar4) = local_38;
  *(MorseType *)(lVar2 + 0x18 + lVar4) = mt;
  if (iVar6 != iVar5) {
    std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>::resize
              (pvVar1 + lVar3,(long)this->nM_);
    lVar2 = *(long *)&(this->MixingMap).
                      super__Vector_base<std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>,_std::allocator<std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar3].
                      super__Vector_base<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>
                      ._M_impl.super__Vector_impl_data;
    lVar7 = lVar7 * 0x20;
    *(RealType *)(lVar2 + lVar7) = local_48;
    *(RealType *)(lVar2 + 8 + lVar7) = local_40;
    *(RealType *)(lVar2 + 0x10 + lVar7) = local_38;
    *(MorseType *)(lVar2 + 0x18 + lVar7) = mt;
  }
  return;
}

Assistant:

void Morse::addExplicitInteraction(AtomType* atype1, AtomType* atype2,
                                     RealType De, RealType Re, RealType beta,
                                     MorseType mt) {
    MorseInteractionData mixer;
    mixer.De      = De;
    mixer.Re      = Re;
    mixer.beta    = beta;
    mixer.variant = mt;

    int atid1 = atype1->getIdent();
    int atid2 = atype2->getIdent();

    int mtid1, mtid2;

    pair<set<int>::iterator, bool> ret;
    ret = Mtypes.insert(atid1);
    if (ret.second == false) {
      // already had this type in the Mtypes list, just get the mtid:
      mtid1 = Mtids[atid1];
    } else {
      // didn't already have it, so make a new one and assign it:
      mtid1        = nM_;
      Mtids[atid1] = nM_;
      nM_++;
    }
    ret = Mtypes.insert(atid2);
    if (ret.second == false) {
      // already had this type in the Mtypes list, just get the mtid:
      mtid2 = Mtids[atid2];
    } else {
      // didn't already have it, so make a new one and assign it:
      mtid2        = nM_;
      Mtids[atid2] = nM_;
      nM_++;
    }

    MixingMap.resize(nM_);
    MixingMap[mtid1].resize(nM_);
    MixingMap[mtid1][mtid2] = mixer;
    if (mtid2 != mtid1) {
      MixingMap[mtid2].resize(nM_);
      MixingMap[mtid2][mtid1] = mixer;
    }
  }